

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O0

Texture * __thiscall
nesvis::PpuHelper::get_pattern_table_texture
          (Texture *__return_storage_ptr__,PpuHelper *this,uint16_t pos,uint16_t pattern_table,
          uint16_t palette)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  IMmu *pIVar4;
  ushort uVar5;
  Rect<int> local_78;
  undefined1 local_66;
  Color local_65;
  byte local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 uStack_5e;
  Color color;
  uint8_t color_index;
  uint8_t bit_b;
  uint8_t bit_a;
  uint16_t mask;
  uint8_t col;
  uint8_t b;
  uint8_t a;
  uint16_t base_address;
  uint8_t row;
  Color local_44;
  undefined1 local_40 [8];
  Image image;
  uint16_t palette_local;
  uint16_t pattern_table_local;
  uint16_t pos_local;
  PpuHelper *this_local;
  Texture *texture;
  
  image.m_pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._2_2_ = palette;
  image.m_pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_2_ = pattern_table;
  image.m_pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_2_ = pos;
  sf::Image::Image((Image *)local_40);
  sf::Color::Color(&local_44,'\n','d','\0',0xff);
  sf::Image::create((Image *)local_40,8,8,&local_44);
  for (mask._1_1_ = 0; mask._1_1_ < 8; mask._1_1_ = mask._1_1_ + 1) {
    uVar5 = image.m_pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._4_2_ * 0x1000 +
            image.m_pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._6_2_ * 0x10 + (ushort)mask._1_1_;
    pIVar4 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    uVar1 = (*pIVar4->_vptr_IMmu[3])(pIVar4,(ulong)uVar5);
    pIVar4 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
    iVar2 = (*pIVar4->_vptr_IMmu[3])(pIVar4,(ulong)(ushort)(uVar5 + 8));
    color.a = (Uint8)iVar2;
    for (color.b = '\0'; color.b < 8; color.b = color.b + '\x01') {
      uVar3 = 1 << (7 - color.b & 0x1f);
      _uStack_5e = (undefined2)uVar3;
      local_5f = (uVar1 & 0xff & uVar3 & 0xffff) != 0;
      local_60 = ((uint)color.a & uVar3 & 0xffff) != 0;
      local_61 = local_5f | local_60 * '\x02';
      local_65 = get_background_color
                           (this,image.m_pixels.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._2_2_,local_61);
      sf::Image::setPixel((Image *)local_40,(uint)color.b,(uint)mask._1_1_,&local_65);
    }
  }
  local_66 = 0;
  sf::Texture::Texture(__return_storage_ptr__);
  sf::Rect<int>::Rect(&local_78);
  sf::Texture::loadFromImage(__return_storage_ptr__,(Image *)local_40,&local_78);
  local_66 = 1;
  sf::Image::~Image((Image *)local_40);
  return __return_storage_ptr__;
}

Assistant:

sf::Texture PpuHelper::get_pattern_table_texture(uint16_t pos,
        uint16_t pattern_table,
        uint16_t palette) {
    sf::Image image;
    image.create(8, 8, sf::Color(10, 100, 0));

    for (uint8_t row = 0; row < 8; ++row) {
        // Second pattern table starts at 0x1000
        const uint16_t base_address = pattern_table * 0x1000 + pos * 16 + row;
        const uint8_t a = nes_->ppu_mmu().read_byte(base_address);
        const uint8_t b = nes_->ppu_mmu().read_byte(base_address + 8u);

        for (uint8_t col = 0; col < 8u; ++col) {
            // First column is the leftmost bit
            const uint16_t mask = 1u << (7u - col);
            const uint8_t bit_a = !!(a & mask);
            const uint8_t bit_b = !!(b & mask);
            const uint8_t color_index =
                    bit_a | static_cast<uint8_t>(bit_b << 1u);

            const auto color = get_background_color(palette, color_index);
            image.setPixel(col, row, color);
        }
    }
    sf::Texture texture;
    texture.loadFromImage(image);
    return texture;
}